

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utf8Helper.h
# Opt level: O3

HRESULT __thiscall
utf8::NarrowStringToWideNoAlloc
          (utf8 *this,LPCSTR sourceString,size_t sourceCount,LPWSTR destString,
          size_t destBufferCount,charcount_t *destCount)

{
  size_t cbDest;
  utf8 uVar1;
  charcount_t cVar2;
  LPCSTR pCVar3;
  utf8char_t *dest;
  size_t sVar4;
  HMODULE pVVar5;
  uint uVar6;
  ulong extraout_RDX;
  utf8 *puVar7;
  utf8 *source;
  utf8char_t *lpLibFileName;
  size_t *psVar8;
  HRESULT HVar9;
  LPCSTR pCVar10;
  
  HVar9 = -0x7ff8fff2;
  if ((LPCSTR)0xfffffffe < sourceString) {
LAB_0010a023:
    *(undefined2 *)sourceCount = 0;
    return HVar9;
  }
  if (sourceCount == 0) {
    return -0x7ff8ffa9;
  }
  HVar9 = -0x7ff8ffa9;
  if (destString <= sourceString) goto LAB_0010a023;
  if (sourceString == (LPCSTR)0x0) {
    pCVar10 = (LPCSTR)0x0;
LAB_0010a041:
    puVar7 = (utf8 *)(sourceString + -(long)pCVar10);
    source = puVar7;
    if (puVar7 != (utf8 *)0x0) {
      source = this + (long)pCVar10;
      cVar2 = ByteIndexIntoCharacterIndex((LPCUTF8)source,(size_t)puVar7,doDefault);
      uVar6 = cVar2 + (int)pCVar10;
      pCVar3 = (LPCSTR)(ulong)uVar6;
      if (sourceString < pCVar3) {
        return -0x7ff8fff2;
      }
      puVar7 = (utf8 *)(sourceCount + (long)pCVar10 * 2);
      destString = (LPWSTR)0x8;
      psVar8 = (size_t *)0x0;
      DecodeUnitsIntoAndNullTerminateNoAdvance
                ((char16 *)puVar7,(LPCUTF8)source,(LPCUTF8)(this + (long)sourceString),
                 doAllowInvalidWCHARs,(bool *)0x0);
      *(uint *)destBufferCount = uVar6;
      goto LAB_0010a093;
    }
  }
  else {
    pCVar3 = (LPCSTR)0x0;
    do {
      uVar1 = this[(long)pCVar3];
      destString = (LPWSTR)(ulong)(uint)(int)(char)uVar1;
      if ((char)uVar1 < '\x01') {
        pCVar10 = (LPCSTR)0x0;
        if ((LPCSTR)0x2 < pCVar3) {
          pCVar10 = pCVar3 + -3;
        }
        goto LAB_0010a041;
      }
      *(short *)(sourceCount + (long)pCVar3 * 2) = (short)(char)uVar1;
      pCVar3 = pCVar3 + 1;
      source = (utf8 *)sourceString;
    } while (sourceString != pCVar3);
  }
  *(int *)destBufferCount = (int)sourceString;
  *(undefined2 *)(sourceCount + (long)sourceString * 2) = 0;
  puVar7 = this;
  psVar8 = (size_t *)destBufferCount;
  pCVar3 = sourceString;
LAB_0010a093:
  if (*(short *)(sourceCount + (long)pCVar3 * 2) == 0) {
    return 0;
  }
  NarrowStringToWideNoAlloc();
  HVar9 = -0x7ff8fff2;
  if (extraout_RDX < 0xffffffff) {
    cbDest = extraout_RDX * 3 + 1;
    dest = (utf8char_t *)(*(code *)puVar7)(cbDest);
    if (dest != (utf8char_t *)0x0) {
      lpLibFileName = dest;
      sVar4 = EncodeIntoAndNullTerminate<(utf8::Utf8EncodingKind)1>
                        (dest,cbDest,(char16 *)source,(charcount_t)extraout_RDX);
      if (cbDest < sVar4) {
        WideStringToNarrow<void*(*)(unsigned_long)>();
        pVVar5 = LoadLibraryExA((LPCSTR)lpLibFileName,(HANDLE)0x0,0);
        return (HRESULT)pVVar5;
      }
      *(utf8char_t **)destString = dest;
      *psVar8 = sVar4;
      HVar9 = 0;
      if ((size_t *)destCount != (size_t *)0x0) {
        *(size_t *)destCount = sVar4;
        HVar9 = 0;
      }
    }
  }
  return HVar9;
}

Assistant:

inline HRESULT NarrowStringToWideNoAlloc(_In_ LPCSTR sourceString, size_t sourceCount,
        __out_ecount(destBufferCount) LPWSTR destString, size_t destBufferCount, _Out_ charcount_t* destCount)
    {
        size_t sourceStart = 0;
        size_t cbSourceString = sourceCount;

        if (sourceCount >= MAXUINT32)
        {
            destString[0] = WCHAR(0);
            return E_OUTOFMEMORY;
        }

        if (destString == nullptr)
        {
            return E_INVALIDARG;
        }

        if (sourceCount >= destBufferCount)
        {
            destString[0] = WCHAR(0);
            return E_INVALIDARG;
        }

        for (; sourceStart < sourceCount; sourceStart++)
        {
            const char ch = sourceString[sourceStart];
            if ( ! (ch > 0 && ch < 0x0080) )
            {
                size_t fallback = sourceStart > 3 ? 3 : sourceStart; // 3 + 1 -> fallback at least 1 unicode char
                sourceStart -= fallback;
                break;
            }
            destString[sourceStart] = (WCHAR) ch;
        }

        if (sourceStart == sourceCount)
        {
            *destCount = static_cast<charcount_t>(sourceCount);
            destString[sourceCount] = WCHAR(0);
        }
        else
        {
            LPCUTF8 remSourceString = (LPCUTF8)sourceString + sourceStart;
            WCHAR *remDestString = destString + sourceStart;

            charcount_t cchDestString = utf8::ByteIndexIntoCharacterIndex(remSourceString, cbSourceString - sourceStart);
            cchDestString += (charcount_t)sourceStart;
            if (cchDestString > sourceCount)
            {
                return E_OUTOFMEMORY;
            }

            // Some node tests depend on the utf8 decoder not swallowing invalid unicode characters
            // instead of replacing them with the "replacement" chracter. Pass a flag to our
            // decoder to require such behavior
            utf8::DecodeUnitsIntoAndNullTerminateNoAdvance(remDestString, remSourceString, (LPCUTF8) sourceString + cbSourceString, DecodeOptions::doAllowInvalidWCHARs);

            static_assert(sizeof(utf8char_t) == sizeof(char), "Needs to be valid for cast");
            *destCount = cchDestString;
        }

        Assert(destString[*destCount] == 0);

        return S_OK;
    }